

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubRoutineLocNonDecimal::SubRoutineLocNonDecimal
          (SubRoutineLocNonDecimal *this)

{
  SubRoutineLocNonDecimal *this_local;
  
  ExplicitUniformLocationCaseBase::ExplicitUniformLocationCaseBase
            (&this->super_ExplicitUniformLocationCaseBase);
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubRoutineLocNonDecimal_0325aa40;
  return;
}

Assistant:

virtual long Run()
	{
		//one shader:
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 0x0a) subroutine uniform st0 u0;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(0x0a, Loc::Hex), 0,
													   DefOccurence::FSH_OR_CSH));
		//layout(location = 010 ) subroutine uniform st0 u1;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(010, Loc::Oct), 0,
													   DefOccurence::FSH_OR_CSH));
		return doRun(subroutineUniforms);
	}